

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  uint *puVar4;
  stbi_uc sVar5;
  byte bVar6;
  uint x;
  uint y;
  char *pcVar7;
  long lVar8;
  byte *pbVar9;
  stbi_uc *psVar10;
  ulong uVar11;
  uchar *puVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int left_1;
  uint req_comp_00;
  stbi_uc *psVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  int *piVar20;
  uint uVar21;
  long *in_FS_OFFSET;
  int left;
  stbi_uc value [4];
  stbi__pic_packet packets [10];
  uint local_cc;
  stbi_uc local_b4 [4];
  undefined8 *local_b0;
  uint local_a4;
  ulong local_a0;
  stbi_uc *local_98;
  uchar *local_90;
  int local_88;
  int local_84;
  uint *local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  uint *local_60;
  stbi_uc local_58 [2];
  byte local_56 [38];
  
  iVar14 = 0x5c;
  local_a4 = req_comp;
  do {
    psVar16 = s->img_buffer;
    if (psVar16 < s->img_buffer_end) {
LAB_001ba8c1:
      s->img_buffer = psVar16 + 1;
    }
    else if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar16 = s->img_buffer;
      goto LAB_001ba8c1;
    }
    iVar14 = iVar14 + -1;
  } while (iVar14 != 0);
  x = stbi__get16be(s);
  y = stbi__get16be(s);
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001ba901:
    if (s->img_buffer_end <= s->img_buffer) {
LAB_001bab5e:
      lVar8 = *in_FS_OFFSET;
      pcVar7 = "bad file";
      goto LAB_001babab;
    }
  }
  else {
    iVar14 = (*(s->io).eof)(s->io_user_data);
    if (iVar14 != 0) {
      if (s->read_from_callbacks != 0) goto LAB_001ba901;
      goto LAB_001bab5e;
    }
  }
  if ((y == 0) || ((x <= (uint)(0x7fffffff / (ulong)y) && (y * x < 0x20000000)))) {
    local_60 = (uint *)px;
    stbi__get16be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    uVar21 = 0;
    local_90 = (uchar *)stbi__malloc_mad3(x,y,4,0);
    if (local_90 != (uchar *)0x0) {
      local_80 = (uint *)py;
      memset(local_90,0xff,(ulong)(y * x * 4));
      local_b0 = (undefined8 *)(*in_FS_OFFSET + -0x20);
      req_comp_00 = 0;
      piVar20 = comp;
      do {
        if (uVar21 == 10) {
          pcVar7 = "bad format";
LAB_001bab1e:
          *local_b0 = pcVar7;
          bVar3 = false;
        }
        else {
          pbVar9 = s->img_buffer;
          if (pbVar9 < s->img_buffer_end) {
LAB_001baa05:
            s->img_buffer = pbVar9 + 1;
            piVar20 = (int *)(ulong)*pbVar9;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar9 = s->img_buffer;
              goto LAB_001baa05;
            }
            piVar20 = (int *)0x0;
          }
          psVar16 = s->img_buffer;
          if (psVar16 < s->img_buffer_end) {
LAB_001baa3e:
            s->img_buffer = psVar16 + 1;
            sVar5 = *psVar16;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              psVar16 = s->img_buffer;
              goto LAB_001baa3e;
            }
            sVar5 = '\0';
          }
          lVar8 = (long)(int)uVar21 * 3;
          local_58[lVar8] = sVar5;
          psVar16 = s->img_buffer;
          if (psVar16 < s->img_buffer_end) {
LAB_001baa8b:
            s->img_buffer = psVar16 + 1;
            sVar5 = *psVar16;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              psVar16 = s->img_buffer;
              goto LAB_001baa8b;
            }
            sVar5 = '\0';
          }
          local_58[lVar8 + 1] = sVar5;
          pbVar9 = s->img_buffer;
          if (pbVar9 < s->img_buffer_end) {
LAB_001baac6:
            s->img_buffer = pbVar9 + 1;
            bVar6 = *pbVar9;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar9 = s->img_buffer;
              goto LAB_001baac6;
            }
            bVar6 = 0;
          }
          uVar21 = uVar21 + 1;
          local_58[lVar8 + 2] = bVar6;
          req_comp_00 = req_comp_00 | bVar6;
          if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001baaf9:
            if (s->img_buffer_end <= s->img_buffer) {
LAB_001bab17:
              pcVar7 = "bad file";
              goto LAB_001bab1e;
            }
          }
          else {
            iVar14 = (*(s->io).eof)(s->io_user_data);
            if (iVar14 != 0) {
              if (s->read_from_callbacks != 0) goto LAB_001baaf9;
              goto LAB_001bab17;
            }
          }
          bVar3 = true;
          pcVar7 = "bad format";
          if (local_58[lVar8] != '\b') goto LAB_001bab1e;
        }
        bVar2 = true;
        if (!bVar3) goto LAB_001baf7b;
      } while ((int)piVar20 != 0);
      req_comp_00 = 4 - ((req_comp_00 & 0x10) == 0);
      if (comp != (int *)0x0) {
        *comp = req_comp_00;
      }
      if (y != 0) {
        local_88 = x * 4;
        local_78 = (ulong)y;
        local_70 = (ulong)uVar21;
        local_a0 = 0;
        do {
          if (0 < (int)uVar21) {
            local_98 = local_90 + local_88 * (int)local_a0;
            uVar11 = 0;
            do {
              lVar8 = uVar11 * 3;
              sVar5 = local_58[lVar8 + 1];
              local_68 = uVar11;
              if (sVar5 == '\0') {
                if (x != 0) {
                  bVar6 = local_58[lVar8 + 2];
                  psVar16 = local_98;
                  uVar17 = x;
                  do {
                    psVar10 = stbi__readval(s,(uint)bVar6,psVar16);
                    if (psVar10 == (stbi_uc *)0x0) goto LAB_001baf7b;
                    psVar16 = psVar16 + 4;
                    uVar17 = uVar17 - 1;
                  } while (uVar17 != 0);
                }
              }
              else {
                psVar16 = local_98;
                uVar17 = x;
                if (sVar5 == '\x01') {
                  while (0 < (int)uVar17) {
                    pbVar9 = s->img_buffer;
                    if (pbVar9 < s->img_buffer_end) {
LAB_001bae22:
                      s->img_buffer = pbVar9 + 1;
                      bVar6 = *pbVar9;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar9 = s->img_buffer;
                        goto LAB_001bae22;
                      }
                      bVar6 = 0;
                    }
                    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001bae4a:
                      if (s->img_buffer < s->img_buffer_end) goto LAB_001bae5a;
LAB_001baeba:
                      *local_b0 = "bad file";
LAB_001baec9:
                      bVar3 = false;
                    }
                    else {
                      iVar14 = (*(s->io).eof)(s->io_user_data);
                      if (iVar14 != 0) {
                        if (s->read_from_callbacks != 0) goto LAB_001bae4a;
                        goto LAB_001baeba;
                      }
LAB_001bae5a:
                      psVar10 = stbi__readval(s,(uint)local_58[lVar8 + 2],local_b4);
                      if (psVar10 == (stbi_uc *)0x0) goto LAB_001baec9;
                      if ((int)uVar17 < (int)(uint)bVar6) {
                        bVar6 = (byte)uVar17;
                      }
                      if (bVar6 != 0) {
                        uVar13 = 0;
                        do {
                          bVar1 = local_58[lVar8 + 2];
                          uVar18 = 0x80;
                          lVar19 = 0;
                          do {
                            if ((uVar18 & bVar1) != 0) {
                              psVar16[lVar19] = local_b4[lVar19];
                            }
                            lVar19 = lVar19 + 1;
                            uVar18 = uVar18 >> 1;
                          } while (lVar19 != 4);
                          uVar13 = uVar13 + 1;
                          psVar16 = psVar16 + 4;
                        } while (uVar13 != bVar6);
                      }
                      uVar17 = uVar17 - bVar6;
                      bVar3 = true;
                    }
                    if (!bVar3) goto LAB_001baf7b;
                  }
                }
                else {
                  local_cc = x;
                  if (sVar5 != '\x02') {
                    *local_b0 = "bad format";
                    goto LAB_001baf7b;
                  }
                  while (0 < (int)local_cc) {
                    pbVar9 = s->img_buffer;
                    if (pbVar9 < s->img_buffer_end) {
LAB_001bacca:
                      s->img_buffer = pbVar9 + 1;
                      bVar6 = *pbVar9;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar9 = s->img_buffer;
                        goto LAB_001bacca;
                      }
                      bVar6 = 0;
                    }
                    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001bacf1:
                      if (s->img_buffer_end <= s->img_buffer) goto LAB_001bad3e;
LAB_001bad01:
                      uVar17 = (uint)bVar6;
                      if ((char)bVar6 < '\0') {
                        if (uVar17 == 0x80) {
                          iVar14 = stbi__get16be(s);
                        }
                        else {
                          iVar14 = uVar17 - 0x7f;
                        }
                        if ((int)local_cc < iVar14) {
                          *local_b0 = "bad file";
LAB_001bade3:
                          bVar3 = false;
                        }
                        else {
                          psVar10 = stbi__readval(s,(uint)local_58[lVar8 + 2],local_b4);
                          if (psVar10 == (stbi_uc *)0x0) goto LAB_001bade3;
                          bVar3 = true;
                          if (0 < iVar14) {
                            iVar15 = 0;
                            do {
                              bVar6 = local_58[lVar8 + 2];
                              uVar17 = 0x80;
                              lVar19 = 0;
                              do {
                                if ((uVar17 & bVar6) != 0) {
                                  psVar16[lVar19] = local_b4[lVar19];
                                }
                                lVar19 = lVar19 + 1;
                                uVar17 = uVar17 >> 1;
                              } while (lVar19 != 4);
                              iVar15 = iVar15 + 1;
                              psVar16 = psVar16 + 4;
                            } while (iVar15 != iVar14);
                          }
                        }
                        if (bVar3) goto LAB_001baded;
                        goto LAB_001bad4d;
                      }
                      if ((int)local_cc <= (int)uVar17) goto LAB_001bad3e;
                      local_84 = uVar17 + 1;
                      iVar15 = uVar17 + 1;
                      do {
                        psVar10 = stbi__readval(s,(uint)local_58[lVar8 + 2],psVar16);
                        if (psVar10 == (stbi_uc *)0x0) goto LAB_001bad4d;
                        psVar16 = psVar16 + 4;
                        iVar15 = iVar15 + -1;
                        iVar14 = local_84;
                      } while (iVar15 != 0);
LAB_001baded:
                      local_cc = local_cc - iVar14;
                      bVar3 = true;
                    }
                    else {
                      iVar14 = (*(s->io).eof)(s->io_user_data);
                      if (iVar14 == 0) goto LAB_001bad01;
                      if (s->read_from_callbacks != 0) goto LAB_001bacf1;
LAB_001bad3e:
                      *local_b0 = "bad file";
LAB_001bad4d:
                      bVar3 = false;
                    }
                    if (!bVar3) goto LAB_001baf7b;
                  }
                }
              }
              uVar11 = local_68 + 1;
            } while (uVar11 != local_70);
          }
          local_a0 = local_a0 + 1;
        } while (local_a0 != local_78);
      }
      bVar2 = false;
LAB_001baf7b:
      puVar4 = local_60;
      puVar12 = local_90;
      if (bVar2) {
        free(local_90);
        puVar12 = (uchar *)0x0;
      }
      *puVar4 = x;
      *local_80 = y;
      if (local_a4 != 0) {
        req_comp_00 = local_a4;
      }
      if (local_a4 == 0 && comp != (int *)0x0) {
        req_comp_00 = *comp;
      }
      puVar12 = stbi__convert_format(puVar12,4,req_comp_00,x,y);
      return puVar12;
    }
    lVar8 = *in_FS_OFFSET;
    pcVar7 = "outofmem";
  }
  else {
    lVar8 = *in_FS_OFFSET;
    pcVar7 = "too large";
  }
LAB_001babab:
  *(char **)(lVar8 + -0x20) = pcVar7;
  return (void *)0x0;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);

   if (y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   if (!result) return stbi__errpuc("outofmem", "Out of memory");
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}